

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Err.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_10bd66::DefaultErrStreamBuf::sync(DefaultErrStreamBuf *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  void *__ptr;
  char *pcVar5;
  size_t size;
  
  lVar3 = std::streambuf::pbase();
  lVar4 = std::streambuf::pptr();
  if (lVar3 != lVar4) {
    iVar1 = std::streambuf::pptr();
    iVar2 = std::streambuf::pbase();
    __ptr = (void *)std::streambuf::pbase();
    fwrite(__ptr,1,(long)(iVar1 - iVar2),_stderr);
    pcVar5 = (char *)std::streambuf::pbase();
    std::streambuf::epptr();
    std::streambuf::setp((char *)this,pcVar5);
  }
  return;
}

Assistant:

virtual int sync()
    {
        // Check if there is something into the write buffer
        if (pbase() != pptr())
        {
            // Print the contents of the write buffer into the standard error output
            std::size_t size = static_cast<int>(pptr() - pbase());
            fwrite(pbase(), 1, size, stderr);

            // Reset the pointer position to the beginning of the write buffer
            setp(pbase(), epptr());
        }

        return 0;
    }